

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darLib.c
# Opt level: O1

void Dar_LibEvalAssignNums(Dar_Man_t *p,int Class,Aig_Obj_t *pRoot)

{
  int iVar1;
  Dar_LibObj_t *pDVar2;
  Dar_LibDat_t *pDVar3;
  Dar_LibObj_t DVar4;
  Dar_LibDat_t *pDVar5;
  Aig_Obj_t *pAVar6;
  Aig_Man_t *pAVar7;
  Vec_Int_t *pVVar8;
  Dar_Lib_t *pDVar9;
  Aig_Obj_t *pAVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  long lVar16;
  float fVar17;
  
  if (0 < s_DarLib->nNodes0[Class]) {
    lVar16 = 0;
    do {
      pDVar9 = s_DarLib;
      iVar1 = s_DarLib->pNodes0[Class][lVar16];
      pDVar2 = s_DarLib->pObjs;
      uVar12 = (int)lVar16 + 4U & 0xfffffff;
      uVar11 = (ulong)uVar12;
      pDVar2[iVar1] = (Dar_LibObj_t)((ulong)pDVar2[iVar1] & 0xfffffffff | uVar11 << 0x24);
      if (pDVar9->nNodes0Max + 4 <= (int)uVar12) {
        __assert_fail("(int)pObj->Num < s_DarLib->nNodes0Max + 4",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dar/darLib.c"
                      ,0x331,"void Dar_LibEvalAssignNums(Dar_Man_t *, int, Aig_Obj_t *)");
      }
      pDVar3 = pDVar9->pDatas;
      pDVar3[uVar11].fMffc = '\0';
      pDVar3[uVar11].field_0.pFunc = (Aig_Obj_t *)0x0;
      pDVar3[uVar11].TravId = 0xffff;
      DVar4 = pDVar9->pObjs[SUB84(pDVar2[iVar1],0) & 0xffff];
      uVar13 = (ulong)DVar4 >> 0x24;
      iVar15 = pDVar9->nNodes0Max + 4;
      if (iVar15 <= (int)(DVar4._4_4_ >> 4)) {
        __assert_fail("(int)Dar_LibObj(s_DarLib, pObj->Fan0)->Num < s_DarLib->nNodes0Max + 4",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dar/darLib.c"
                      ,0x338,"void Dar_LibEvalAssignNums(Dar_Man_t *, int, Aig_Obj_t *)");
      }
      DVar4 = pDVar9->pObjs[SUB84(pDVar2[iVar1],0) >> 0x10];
      uVar14 = (ulong)DVar4 >> 0x24;
      if (iVar15 <= (int)(DVar4._4_4_ >> 4)) {
        __assert_fail("(int)Dar_LibObj(s_DarLib, pObj->Fan1)->Num < s_DarLib->nNodes0Max + 4",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dar/darLib.c"
                      ,0x339,"void Dar_LibEvalAssignNums(Dar_Man_t *, int, Aig_Obj_t *)");
      }
      pDVar3 = pDVar3 + uVar11;
      pDVar5 = pDVar9->pDatas;
      iVar15 = pDVar5[uVar14].Level;
      if (pDVar5[uVar14].Level < pDVar5[uVar13].Level) {
        iVar15 = pDVar5[uVar13].Level;
      }
      pDVar3->Level = iVar15 + 1;
      pAVar10 = pDVar5[uVar13].field_0.pFunc;
      if ((((pAVar10 != (Aig_Obj_t *)0x0) &&
           (pAVar6 = pDVar5[uVar14].field_0.pFunc, pAVar6 != (Aig_Obj_t *)0x0)) &&
          ((Aig_Obj_t *)((ulong)pAVar10 & 0xfffffffffffffffe) != pRoot)) &&
         ((Aig_Obj_t *)((ulong)pAVar6 & 0xfffffffffffffffe) != pRoot)) {
        pAVar10 = Aig_TableLookupTwo(p->pAig,(Aig_Obj_t *)
                                             ((ulong)(SUB84(pDVar2[iVar1],4) & 1) ^ (ulong)pAVar10),
                                     (Aig_Obj_t *)
                                     ((ulong)(SUB84(pDVar2[iVar1],4) >> 1 & 1) ^ (ulong)pAVar6));
        (pDVar3->field_0).pFunc = pAVar10;
        if (pAVar10 != (Aig_Obj_t *)0x0) {
          uVar11 = (ulong)pAVar10 & 0xfffffffffffffffe;
          pDVar3->Level = *(uint *)(uVar11 + 0x1c) & 0xffffff;
          pAVar7 = p->pAig;
          pDVar3->fMffc = *(int *)(uVar11 + 0x20) == pAVar7->nTravIds;
          if (p->pPars->fPower != 0) {
            iVar1 = *(int *)(uVar11 + 0x24);
            if (((long)iVar1 < 0) || (pVVar8 = pAVar7->vProbs, pVVar8->nSize <= iVar1)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                            ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            fVar17 = (float)pVVar8->pArray[iVar1];
            if (((ulong)pAVar10 & 1) != 0) {
              fVar17 = 1.0 - fVar17;
            }
            pDVar3->dProb = fVar17;
          }
        }
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 < s_DarLib->nNodes0[Class]);
  }
  return;
}

Assistant:

void Dar_LibEvalAssignNums( Dar_Man_t * p, int Class, Aig_Obj_t * pRoot )
{
    Dar_LibObj_t * pObj;
    Dar_LibDat_t * pData, * pData0, * pData1;
    Aig_Obj_t * pFanin0, * pFanin1;
    int i;
    for ( i = 0; i < s_DarLib->nNodes0[Class]; i++ )
    {
        // get one class node, assign its temporary number and set its data
        pObj = Dar_LibObj(s_DarLib, s_DarLib->pNodes0[Class][i]);
        pObj->Num = 4 + i;
        assert( (int)pObj->Num < s_DarLib->nNodes0Max + 4 );
        pData = s_DarLib->pDatas + pObj->Num;
        pData->fMffc = 0;
        pData->pFunc = NULL;
        pData->TravId = 0xFFFF;

        // explore the fanins
        assert( (int)Dar_LibObj(s_DarLib, pObj->Fan0)->Num < s_DarLib->nNodes0Max + 4 );
        assert( (int)Dar_LibObj(s_DarLib, pObj->Fan1)->Num < s_DarLib->nNodes0Max + 4 );
        pData0 = s_DarLib->pDatas + Dar_LibObj(s_DarLib, pObj->Fan0)->Num;
        pData1 = s_DarLib->pDatas + Dar_LibObj(s_DarLib, pObj->Fan1)->Num;
        pData->Level = 1 + Abc_MaxInt(pData0->Level, pData1->Level);
        if ( pData0->pFunc == NULL || pData1->pFunc == NULL )
            continue;
        pFanin0 = Aig_NotCond( pData0->pFunc, pObj->fCompl0 );
        pFanin1 = Aig_NotCond( pData1->pFunc, pObj->fCompl1 );
        if ( Aig_Regular(pFanin0) == pRoot || Aig_Regular(pFanin1) == pRoot )
            continue;
        pData->pFunc = Aig_TableLookupTwo( p->pAig, pFanin0, pFanin1 );
        if ( pData->pFunc )
        {
            // update the level to be more accurate
            pData->Level = Aig_Regular(pData->pFunc)->Level;
            // mark the node if it is part of MFFC
            pData->fMffc = Aig_ObjIsTravIdCurrent(p->pAig, Aig_Regular(pData->pFunc));
            // assign the probability
            if ( p->pPars->fPower )
            {
                float Prob = Abc_Int2Float( Vec_IntEntry( p->pAig->vProbs, Aig_ObjId(Aig_Regular(pData->pFunc)) ) );
                pData->dProb = Aig_IsComplement(pData->pFunc)? 1.0-Prob : Prob;
            }
        }
    }
}